

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chomp.c
# Opt level: O3

char * chomp(char *str)

{
  bool bVar1;
  ulong uVar2;
  
  if (str != (char *)0x0) {
    uVar2 = strlen(str);
    if (0 < (int)(uint)uVar2) {
      uVar2 = (ulong)((uint)uVar2 & 0x7fffffff);
      do {
        if ((str[uVar2 - 1] != '\r') && (str[uVar2 - 1] != '\n')) goto LAB_0016add0;
        bVar1 = 1 < (long)uVar2;
        uVar2 = uVar2 - 1;
      } while (bVar1);
      uVar2 = 0;
    }
LAB_0016add0:
    str[(int)uVar2] = '\0';
  }
  return str;
}

Assistant:

char *chomp(char *str)
{
    if (str) {
        int len = strlen(str);
        while (len > 0 && (str[len-1] == '\r' || str[len-1] == '\n'))
            len--;
        str[len] = '\0';
    }
    return str;
}